

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::
int_writer<char,_fmt::v5::basic_format_specs<char>_>::on_num
          (int_writer<char,_fmt::v5::basic_format_specs<char>_> *this)

{
  _Head_base<0UL,_fmt::v5::locale_provider_*,_false> _Var1;
  uint uVar2;
  num_writer f;
  undefined1 uVar3;
  numpunct *pnVar4;
  uint uVar5;
  uint uVar6;
  string_view prefix;
  locale loc;
  undefined4 local_40;
  locale local_38 [8];
  
  uVar6 = this->abs_value;
  uVar2 = 0x1f;
  if ((uVar6 | 1) != 0) {
    for (; (uVar6 | 1) >> uVar2 == 0; uVar2 = uVar2 - 1) {
    }
  }
  uVar5 = (uVar2 ^ 0xffffffe0) * 0x4d1 + 0x9ef1 >> 0xc;
  uVar2 = *(uint *)(internal::basic_data<void>::ZERO_OR_POWERS_OF_10_32 + (ulong)uVar5 * 4);
  _Var1._M_head_impl =
       (this->writer->locale_)._M_t.
       super___uniq_ptr_impl<fmt::v5::locale_provider,_std::default_delete<fmt::v5::locale_provider>_>
       ._M_t.
       super__Tuple_impl<0UL,_fmt::v5::locale_provider_*,_std::default_delete<fmt::v5::locale_provider>_>
       .super__Head_base<0UL,_fmt::v5::locale_provider_*,_false>._M_head_impl;
  if (_Var1._M_head_impl == (locale_provider *)0x0) {
    std::locale::locale(&loc);
  }
  else {
    (*(_Var1._M_head_impl)->_vptr_locale_provider[2])(local_38,_Var1._M_head_impl);
    std::locale::locale(&loc,local_38);
    std::locale::~locale(local_38);
  }
  pnVar4 = std::use_facet<std::__cxx11::numpunct<char>>(&loc);
  uVar3 = (**(code **)(*(long *)pnVar4 + 0x18))(pnVar4);
  std::locale::~locale(&loc);
  uVar6 = (uVar2 <= uVar6) + uVar5 + (uVar5 - (uVar6 < uVar2)) / 3;
  local_40 = CONCAT31(local_40._1_3_,uVar3);
  f.size = uVar6;
  f.abs_value = this->abs_value;
  f._8_4_ = local_40;
  prefix.size_._0_4_ = this->prefix_size;
  prefix.data_ = this->prefix;
  prefix.size_._4_4_ = 0;
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
  write_int<fmt::v5::basic_format_specs<char>,fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::int_writer<char,fmt::v5::basic_format_specs<char>>::num_writer>
            ((basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>> *)
             this->writer,uVar6,prefix,this->spec,f);
  return;
}

Assistant:

void on_num() {
      unsigned num_digits = internal::count_digits(abs_value);
      char_type sep = internal::thousands_sep<char_type>(writer.locale_.get());
      unsigned size = num_digits + SEP_SIZE * ((num_digits - 1) / 3);
      writer.write_int(size, get_prefix(), spec,
                       num_writer{abs_value, size, sep});
    }